

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_io_device.cpp
# Opt level: O2

void __thiscall
booster::aio::basic_io_device::set_non_blocking
          (basic_io_device *this,bool nonblocking,error_code *e)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  error_code eVar4;
  
  uVar1 = fcntl(this->fd_,3,0);
  if ((int)uVar1 < 0) {
    eVar4 = socket_details::geterror();
    e->_M_value = eVar4._M_value;
    e->_M_cat = eVar4._M_cat;
  }
  else {
    uVar2 = uVar1 & 0x7ffff7ff;
    if (nonblocking) {
      uVar2 = uVar1 | 0x800;
    }
    iVar3 = fcntl(this->fd_,4,(ulong)uVar2);
    if (iVar3 < 0) {
      eVar4 = socket_details::geterror();
      e->_M_value = eVar4._M_value;
      e->_M_cat = eVar4._M_cat;
    }
    this->nonblocking_was_set_ = nonblocking;
  }
  return;
}

Assistant:

void basic_io_device::set_non_blocking(bool nonblocking,system::error_code &e)
{
	#if defined BOOSTER_WIN32
	unsigned long opt =  nonblocking;
	if(::ioctlsocket(fd_,FIONBIO,&opt) < 0)
		e=geterror();
	#elif ! defined(O_NONBLOCK)
	int opt = nonblocking;
	if(::ioctl(fd_,FIONBIO,&opt) < 0)
		e=geterror();
	#else 
	int flags = ::fcntl(fd_,F_GETFL,0);
	if(flags < 0) {
		e=geterror();
		return;
	}
	if(nonblocking)
		flags = flags | O_NONBLOCK;
	else
		flags = flags & ~O_NONBLOCK;

	if(::fcntl(fd_,F_SETFL,flags) < 0)
		e=geterror();
	#endif
	nonblocking_was_set_=nonblocking;
}